

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Embed(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Emb_Par_t *pPars;
  undefined4 local_48;
  Emb_Par_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pPars._4_4_ = 0x1e;
  Pars.nDims = 10;
  local_48 = 2;
  Pars.nSols = 0;
  Pars.nIters = 0;
  Pars.fRefine = 0;
  Pars.fCluster = 0;
  Pars.fDump = 0;
  Pars.fDumpLarge = 0;
  Pars._28_8_ = argv;
  Extra_UtilGetoptReset();
LAB_002ad3d4:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._28_8_,"DIrcdlsvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Embed(): There is no AIG.\n");
        return 1;
      }
      Gia_ManSolveProblem(pAbc->pGia,(Emb_Par_t *)((long)&pPars + 4));
      return 0;
    }
    switch(iVar1) {
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002ad5a5;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    default:
      goto LAB_002ad5a5;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002ad5a5;
      }
      Pars.nDims = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nDims;
      break;
    case 99:
      Pars.nIters = Pars.nIters ^ 1;
      goto LAB_002ad3d4;
    case 100:
      Pars.fRefine = Pars.fRefine ^ 1;
      goto LAB_002ad3d4;
    case 0x68:
      goto LAB_002ad5a5;
    case 0x6c:
      Pars.fCluster = Pars.fCluster ^ 1;
      goto LAB_002ad3d4;
    case 0x72:
      Pars.nSols = Pars.nSols ^ 1;
      goto LAB_002ad3d4;
    case 0x73:
      Pars.fDump = Pars.fDump ^ 1;
      goto LAB_002ad3d4;
    case 0x76:
      Pars.fDumpLarge = Pars.fDumpLarge ^ 1;
      goto LAB_002ad3d4;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002ad5a5:
      Abc_Print(-2,"usage: &embed [-DI <num>] [-rdlscvh]\n");
      Abc_Print(-2,"\t         fast placement based on high-dimensional embedding from\n");
      Abc_Print(-2,"\t         D. Harel and Y. Koren, \"Graph drawing by high-dimensional\n");
      Abc_Print(-2,"\t         embedding\", J. Graph Algs & Apps, 2004, Vol 8(2), pp. 195-217\n");
      Abc_Print(-2,"\t-D num : the number of dimensions for embedding [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-I num : the number of refinement iterations [default = %d]\n",
                (ulong)(uint)Pars.nDims);
      pcVar3 = "no";
      if (Pars.nSols != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle the use of refinement [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.nIters != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle clustered representation [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fRefine != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dumping placement into a Gnuplot file [default = %s]\n",pcVar3
               );
      pcVar3 = "no";
      if (Pars.fCluster != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle dumping Gnuplot for large placement [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fDump != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle showing image if Gnuplot is installed [default = %s]\n",pcVar3
               );
      pcVar3 = "no";
      if (Pars.fDumpLarge != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Embed( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Emb_Par_t Pars, * pPars = &Pars;
    int c;
    pPars->nDims      = 30;
    pPars->nIters     = 10;
    pPars->nSols      =  2;
    pPars->fRefine    =  0;
    pPars->fCluster   =  0;
    pPars->fDump      =  0;
    pPars->fDumpLarge =  0;
    pPars->fShowImage =  0;
    pPars->fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DIrcdlsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDims = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDims < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fRefine ^= 1;
            break;
        case 'c':
            pPars->fCluster ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'l':
            pPars->fDumpLarge ^= 1;
            break;
        case 's':
            pPars->fShowImage ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Embed(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSolveProblem( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &embed [-DI <num>] [-rdlscvh]\n" );
    Abc_Print( -2, "\t         fast placement based on high-dimensional embedding from\n" );
    Abc_Print( -2, "\t         D. Harel and Y. Koren, \"Graph drawing by high-dimensional\n" );
    Abc_Print( -2, "\t         embedding\", J. Graph Algs & Apps, 2004, Vol 8(2), pp. 195-217\n" );
    Abc_Print( -2, "\t-D num : the number of dimensions for embedding [default = %d]\n", pPars->nDims );
    Abc_Print( -2, "\t-I num : the number of refinement iterations [default = %d]\n", pPars->nIters );
    Abc_Print( -2, "\t-r     : toggle the use of refinement [default = %s]\n", pPars->fRefine? "yes":"no");
    Abc_Print( -2, "\t-c     : toggle clustered representation [default = %s]\n", pPars->fCluster? "yes":"no");
    Abc_Print( -2, "\t-d     : toggle dumping placement into a Gnuplot file [default = %s]\n", pPars->fDump? "yes":"no");
    Abc_Print( -2, "\t-l     : toggle dumping Gnuplot for large placement [default = %s]\n", pPars->fDumpLarge? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle showing image if Gnuplot is installed [default = %s]\n", pPars->fShowImage? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}